

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

String * doctest::toString(float in)

{
  String *in_RDI;
  int in_stack_00000198;
  float in_stack_0000019c;
  String *in_stack_ffffffffffffffb0;
  String *in_stack_ffffffffffffffe0;
  String *in_stack_ffffffffffffffe8;
  
  anon_unknown_14::fpToString<float>(in_stack_0000019c,in_stack_00000198);
  String::String(in_stack_ffffffffffffffb0,(char *)in_RDI);
  operator+(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  String::~String(in_stack_ffffffffffffffb0);
  String::~String(in_stack_ffffffffffffffb0);
  return in_RDI;
}

Assistant:

String toString(float in) { return fpToString(in, 5) + "f"; }